

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O0

uint32_t nd_add_m10e(uint32_t *nd,uint32_t ndhi,uint8_t m,int32_t e)

{
  int iVar1;
  uint uVar2;
  uint32_t val;
  int32_t f;
  uint32_t carry;
  uint32_t i;
  int32_t e_local;
  uint8_t m_local;
  uint32_t ndhi_local;
  uint32_t *nd_local;
  
  if (e < 0) {
    iVar1 = (e + -8) / 9;
    i = iVar1 + 0x40;
    carry = (uint)m * (ndigits_dec_threshold[e + iVar1 * -9] + 1);
  }
  else {
    i = (uint)e / 9;
    carry = (uint)m * (ndigits_dec_threshold[(int)((uint)e % 9)] + 1);
  }
  while( true ) {
    uVar2 = nd[i] + carry;
    if (uVar2 < 1000000000) {
      nd[i] = uVar2;
      return ndhi;
    }
    nd[i] = uVar2 + 0xc4653600;
    if (i == ndhi) break;
    carry = 1;
    i = i + 1 & 0x3f;
  }
  uVar2 = ndhi + 1 & 0x3f;
  nd[uVar2] = 1;
  return uVar2;
}

Assistant:

static uint32_t nd_add_m10e(uint32_t* nd, uint32_t ndhi, uint8_t m, int32_t e)
{
  uint32_t i, carry;
  if (e >= 0) {
    i = (uint32_t)e/9;
    carry = m * (ndigits_dec_threshold[e - (int32_t)i*9] + 1);
  } else {
    int32_t f = (e-8)/9;
    i = (uint32_t)(64 + f);
    carry = m * (ndigits_dec_threshold[e - f*9] + 1);
  }
  for (;;) {
    uint32_t val = nd[i] + carry;
    if (LJ_UNLIKELY(val >= 1000000000)) {
      val -= 1000000000;
      nd[i] = val;
      if (LJ_UNLIKELY(i == ndhi)) {
	ndhi = (ndhi + 1) & 0x3f;
	nd[ndhi] = 1;
	break;
      }
      carry = 1;
      i = (i + 1) & 0x3f;
    } else {
      nd[i] = val;
      break;
    }
  }
  return ndhi;
}